

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::addBuffer(CLIntercept *this,cl_mem buffer)

{
  mapped_type mVar1;
  size_t sVar2;
  cl_int cVar3;
  mapped_type *pmVar4;
  mapped_type_conflict *pmVar5;
  size_t size;
  cl_mem buffer_local;
  cl_mem local_28;
  
  if (buffer != (cl_mem)0x0) {
    buffer_local = buffer;
    std::mutex::lock(&this->m_Mutex);
    size = 0;
    cVar3 = (*(this->m_Dispatch).clGetMemObjectInfo)(buffer,0x1102,8,&size,(size_t *)0x0);
    if (cVar3 == 0) {
      mVar1 = this->m_MemAllocNumber;
      local_28 = buffer;
      pmVar4 = std::
               map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
               ::operator[](&this->m_MemAllocNumberMap,&local_28);
      sVar2 = size;
      *pmVar4 = mVar1;
      pmVar5 = std::
               map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
               ::operator[](&this->m_BufferInfoMap,&buffer_local);
      *pmVar5 = sVar2;
      this->m_MemAllocNumber = this->m_MemAllocNumber + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  }
  return;
}

Assistant:

void CLIntercept::addBuffer(
    cl_mem buffer )
{
    if( buffer )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        cl_int  errorCode = CL_SUCCESS;
        size_t  size = 0;

        errorCode |= dispatch().clGetMemObjectInfo(
            buffer,
            CL_MEM_SIZE,
            sizeof( size_t ),
            &size,
            NULL );

        if( errorCode == CL_SUCCESS )
        {
            m_MemAllocNumberMap[ buffer ] = m_MemAllocNumber;
            m_BufferInfoMap[ buffer ] = size;
            m_MemAllocNumber++;
        }
    }
}